

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O1

void __thiscall
pbrt::SummedAreaTable::SummedAreaTable(SummedAreaTable *this,Array2D<float> *values,Allocator alloc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  double *pdVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  Bounds2i local_40;
  
  uVar6 = (values->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x -
          (values->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x;
  uVar7 = (values->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y -
          (values->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y;
  local_40.pMin.super_Tuple2<pbrt::Point2,_int>.x = (int)uVar6 >> 0x1f & uVar6;
  local_40.pMin.super_Tuple2<pbrt::Point2,_int>.y = (int)uVar7 >> 0x1f & uVar7;
  uVar9 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar9 = 0;
  }
  uVar8 = (ulong)uVar7;
  if ((int)uVar7 < 1) {
    uVar8 = 0;
  }
  local_40.pMax.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(uVar9 | uVar8 << 0x20)
  ;
  Array2D<double>::Array2D(&this->sum,&local_40,alloc);
  iVar14 = (values->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x;
  iVar1 = (values->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y;
  pfVar4 = values->values;
  iVar12 = (values->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x - iVar14;
  iVar15 = iVar12 * iVar1 + iVar14;
  iVar2 = (this->sum).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
  iVar3 = (this->sum).extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
  pdVar5 = (this->sum).values;
  uVar6 = (this->sum).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x - iVar2;
  iVar11 = uVar6 * iVar3 + iVar2;
  uVar7 = -iVar11;
  uVar9 = (ulong)uVar7;
  pdVar5[(int)uVar7] = (double)pfVar4[-iVar15];
  uVar8 = (ulong)uVar6;
  if (1 < (int)uVar6) {
    iVar11 = -iVar11;
    iVar15 = -iVar15;
    lVar16 = uVar8 - 1;
    do {
      iVar15 = iVar15 + 1;
      lVar13 = (long)iVar11;
      iVar11 = iVar11 + 1;
      pdVar5[iVar11] = (double)pfVar4[iVar15] + pdVar5[lVar13];
      lVar16 = lVar16 + -1;
    } while (lVar16 != 0);
  }
  uVar10 = (this->sum).extent.pMax.super_Tuple2<pbrt::Point2,_int>.y - iVar3;
  if (1 < (int)uVar10) {
    iVar15 = (1 - iVar3) * uVar6 - iVar2;
    iVar11 = (1 - iVar1) * iVar12 - iVar14;
    lVar16 = (ulong)uVar10 - 1;
    do {
      pdVar5[iVar15] = (double)pfVar4[iVar11] + pdVar5[(int)uVar7];
      iVar15 = iVar15 + uVar6;
      iVar11 = iVar11 + iVar12;
      uVar7 = uVar7 + uVar6;
      lVar16 = lVar16 + -1;
    } while (lVar16 != 0);
  }
  if (1 < (int)uVar10) {
    uVar7 = 1;
    uVar17 = (ulong)((1 - iVar3) * uVar6 - iVar2);
    iVar14 = ((1 - iVar1) * iVar12 - iVar14) + 1;
    do {
      if (1 < (int)uVar6) {
        lVar16 = 0;
        do {
          iVar1 = (int)lVar16;
          iVar2 = (int)uVar9 + iVar1;
          pdVar5[(int)uVar17 + 1 + iVar1] =
               ((double)pfVar4[iVar14 + iVar1] + pdVar5[(int)uVar17 + iVar1] + pdVar5[iVar2 + 1]) -
               pdVar5[iVar2];
          lVar16 = lVar16 + 1;
        } while (uVar8 - 1 != lVar16);
      }
      uVar7 = uVar7 + 1;
      uVar17 = uVar17 + uVar8;
      uVar9 = uVar9 + uVar8;
      iVar14 = iVar14 + iVar12;
    } while (uVar7 != uVar10);
  }
  return;
}

Assistant:

SummedAreaTable(const Array2D<Float> &values, Allocator alloc = {})
        : sum(values.xSize(), values.ySize(), alloc) {
        sum(0, 0) = values(0, 0);
        // Compute sums along first scanline and column
        for (int x = 1; x < sum.xSize(); ++x)
            sum(x, 0) = values(x, 0) + sum(x - 1, 0);
        for (int y = 1; y < sum.ySize(); ++y)
            sum(0, y) = values(0, y) + sum(0, y - 1);

        // Compute sums for the remainder of the entries
        for (int y = 1; y < sum.ySize(); ++y)
            for (int x = 1; x < sum.xSize(); ++x)
                sum(x, y) =
                    (values(x, y) + sum(x - 1, y) + sum(x, y - 1) - sum(x - 1, y - 1));
    }